

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool DoLoadGLNodes(FileReader **lumps)

{
  bool bVar1;
  uint uVar2;
  int missing;
  seg_t *seg;
  int i;
  FileReader **lumps_local;
  
  bVar1 = LoadGLVertexes(*lumps);
  if (bVar1) {
    bVar1 = LoadGLSegs(lumps[1]);
    if (bVar1) {
      bVar1 = LoadGLSubsectors(lumps[2]);
      if (bVar1) {
        bVar1 = LoadNodes(lumps[3]);
        if (bVar1) {
          for (seg._4_4_ = 0; seg._4_4_ < numsubsectors; seg._4_4_ = seg._4_4_ + 1) {
            if ((subsectors[seg._4_4_].firstline)->sidedef == (side_t *)0x0) {
              Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
              if (nodes != (node_t *)0x0) {
                operator_delete__(nodes);
              }
              nodes = (node_t *)0x0;
              if (subsectors != (subsector_t *)0x0) {
                operator_delete__(subsectors);
              }
              subsectors = (subsector_t *)0x0;
              if (segs != (seg_t *)0x0) {
                operator_delete__(segs);
              }
              segs = (seg_t *)0x0;
              return false;
            }
          }
          uVar2 = CheckForMissingSegs();
          if (0 < (int)uVar2) {
            Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n",(ulong)uVar2
                  );
          }
          lumps_local._7_1_ = uVar2 == 0;
        }
        else {
          if (nodes != (node_t *)0x0) {
            operator_delete__(nodes);
          }
          nodes = (node_t *)0x0;
          if (subsectors != (subsector_t *)0x0) {
            operator_delete__(subsectors);
          }
          subsectors = (subsector_t *)0x0;
          if (segs != (seg_t *)0x0) {
            operator_delete__(segs);
          }
          segs = (seg_t *)0x0;
          lumps_local._7_1_ = false;
        }
      }
      else {
        if (subsectors != (subsector_t *)0x0) {
          operator_delete__(subsectors);
        }
        subsectors = (subsector_t *)0x0;
        if (segs != (seg_t *)0x0) {
          operator_delete__(segs);
        }
        segs = (seg_t *)0x0;
        lumps_local._7_1_ = false;
      }
    }
    else {
      if (segs != (seg_t *)0x0) {
        operator_delete__(segs);
      }
      segs = (seg_t *)0x0;
      lumps_local._7_1_ = false;
    }
  }
  else {
    lumps_local._7_1_ = false;
  }
  return lumps_local._7_1_;
}

Assistant:

static bool DoLoadGLNodes(FileReader ** lumps)
{
	if (!LoadGLVertexes(lumps[0]))
	{
		return false;
	}
	if (!LoadGLSegs(lumps[1]))
	{
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadGLSubsectors(lumps[2]))
	{
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadNodes(lumps[3]))
	{
		delete [] nodes;
		nodes = NULL;
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}

	// Quick check for the validity of the nodes
	// For invalid nodes there is a high chance that this test will fail

	for (int i = 0; i < numsubsectors; i++)
	{
		seg_t * seg = subsectors[i].firstline;
		if (!seg->sidedef) 
		{
			Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
			delete [] nodes;
			nodes = NULL;
			delete [] subsectors;
			subsectors = NULL;
			delete [] segs;
			segs = NULL;
			return false;
		}
	}

	// check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n", missing);
	}
	return missing == 0;
}